

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManComputeOverlapOne(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  Gia_ManIncrementTravId(p);
  lVar3 = 0;
  while( true ) {
    iVar1 = Gia_ObjLutSize(p,iObj);
    if (iVar1 <= lVar3) break;
    piVar2 = Gia_ObjLutFanins(p,iObj);
    Gia_ObjSetTravIdCurrentId(p,piVar2[lVar3]);
    lVar3 = lVar3 + 1;
  }
  iVar1 = Gia_ManComputeOverlapOne_rec(p,iObj);
  return iVar1;
}

Assistant:

int Gia_ManComputeOverlapOne( Gia_Man_t * p, int iObj )
{
    int iFan, k;
    Gia_ManIncrementTravId(p);
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Gia_ObjSetTravIdCurrentId( p, iFan );
    return Gia_ManComputeOverlapOne_rec( p, iObj );
}